

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binarization.cpp
# Opt level: O3

binarization * __thiscall
pobr::imgProcessing::utils::binarization::binarizeImage(binarization *this,Mat *img,uint *threshold)

{
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  cv::Mat::clone();
  local_38._8_8_ = 0;
  local_38._M_unused._M_object = operator_new(0x18);
  *(Mat **)local_38._M_unused._0_8_ = img;
  *(uint **)((long)local_38._M_unused._0_8_ + 8) = threshold;
  *(binarization **)((long)local_38._M_unused._0_8_ + 0x10) = this;
  local_20 = std::
             _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/binarization.cpp:57:9)>
             ::_M_invoke;
  local_28 = std::
             _Function_handler<void_(const_unsigned_long_&,_const_unsigned_long_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mdziekon[P]eiti-pobr-logo-recognition/src/img-processing/utils/binarization.cpp:57:9)>
             ::_M_manager;
  matrixOps::forEachPixel
            (img,(function<void_(const_unsigned_long_&,_const_unsigned_long_&)> *)&local_38);
  if (local_28 != (code *)0x0) {
    (*local_28)(&local_38,&local_38,__destroy_functor);
  }
  return this;
}

Assistant:

cv::Mat
binarization::binarizeImage(const cv::Mat& img, const unsigned int& threshold)
{
    auto resultImg = img.clone();

    matrixOps::forEachPixel(
        img,
        [&](const uint64_t& x, const uint64_t& y) -> void
        {
            auto& thisPixel = img.at<cv::Vec3b>(y, x);

            uint8_t value;

            if (thisPixel[0] > threshold && thisPixel[1] > threshold && thisPixel[2] > threshold)
            {
                value = 255;
            }
            else
            {
                value = 0;
            }

            resultImg.at<cv::Vec3b>(y, x)[0] = value;
            resultImg.at<cv::Vec3b>(y, x)[1] = value;
            resultImg.at<cv::Vec3b>(y, x)[2] = value;
        }
    );

    return resultImg;
}